

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall Centaurus::Grammar<char>::~Grammar(Grammar<char> *this)

{
  Grammar<char> *this_local;
  
  (this->super_IGrammar)._vptr_IGrammar = (_func_int **)&PTR__Grammar_00255858;
  GrammarOptions::~GrammarOptions(&this->m_options);
  Identifier::~Identifier(&this->m_grammar_name);
  Identifier::~Identifier(&this->m_root_id);
  std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::~vector
            (&this->m_identifiers);
  std::
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<char>_>_>_>
  ::~unordered_map(&this->m_networks);
  IGrammar::~IGrammar(&this->super_IGrammar);
  return;
}

Assistant:

virtual ~Grammar()
    {
    }